

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

uint Validator::constraintS7(Solution *solution)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *this;
  Nurse *pNVar5;
  History *this_00;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar6;
  size_type sVar7;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar8;
  const_reference ppTVar9;
  Scenario *pSVar10;
  string *psVar11;
  string local_110;
  Contract local_f0;
  string local_a0;
  Contract local_80;
  int local_3c;
  reference ppStack_38;
  int numberOfWorkingWeekends;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  *nurse;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__range1;
  uint sum;
  Solution *solution_local;
  
  __range1._4_4_ = 0;
  this = Solution::getNurses_abi_cxx11_(solution);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
           ::begin(this);
  nurse = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::end(this);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&nurse);
    if (!bVar2) {
      return __range1._4_4_;
    }
    ppStack_38 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
                 ::operator*(&__end1);
    pNVar5 = NurseSolution::getNurse(ppStack_38->second);
    this_00 = Nurse::getHistory(pNVar5);
    local_3c = History::getNumberOfWorkingWeekends(this_00);
    pvVar6 = NurseSolution::getTurns(ppStack_38->second);
    sVar7 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(pvVar6);
    if (sVar7 != 0) {
      pvVar6 = NurseSolution::getTurns(ppStack_38->second);
      pvVar8 = NurseSolution::getTurns(ppStack_38->second);
      sVar7 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(pvVar8);
      ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[](pvVar6,sVar7 - 1);
      iVar3 = Turn::getDay(*ppTVar9);
      if (iVar3 != 6) {
        pvVar6 = NurseSolution::getTurns(ppStack_38->second);
        pvVar8 = NurseSolution::getTurns(ppStack_38->second);
        sVar7 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(pvVar8);
        ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[](pvVar6,sVar7 - 1);
        iVar3 = Turn::getDay(*ppTVar9);
        if (iVar3 != 5) goto LAB_0013357c;
      }
      local_3c = local_3c + 1;
    }
LAB_0013357c:
    iVar3 = local_3c;
    pSVar10 = Scenario::getInstance();
    pNVar5 = NurseSolution::getNurse(ppStack_38->second);
    psVar11 = Nurse::getContract_abi_cxx11_(pNVar5);
    std::__cxx11::string::string((string *)&local_a0,(string *)psVar11);
    Scenario::getContract(&local_80,pSVar10,&local_a0);
    iVar4 = Contract::getMaximumNumberOfWorkingWeekends(&local_80);
    Contract::~Contract(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    iVar1 = local_3c;
    if (iVar4 < iVar3) {
      pSVar10 = Scenario::getInstance();
      pNVar5 = NurseSolution::getNurse(ppStack_38->second);
      psVar11 = Nurse::getContract_abi_cxx11_(pNVar5);
      std::__cxx11::string::string((string *)&local_110,(string *)psVar11);
      Scenario::getContract(&local_f0,pSVar10,&local_110);
      iVar3 = Contract::getMaximumNumberOfWorkingWeekends(&local_f0);
      __range1._4_4_ = (iVar1 - iVar3) * 0x1e + __range1._4_4_;
      Contract::~Contract(&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

unsigned int Validator::constraintS7(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int numberOfWorkingWeekends = nurse.second->getNurse()->getHistory().getNumberOfWorkingWeekends();


        if(nurse.second->getTurns().size() > 0)
            if(nurse.second->getTurns()[nurse.second->getTurns().size() - 1]->getDay() == 6 || nurse.second->getTurns()[nurse.second->getTurns().size() - 1]->getDay() == 5)
                numberOfWorkingWeekends++;

        if(numberOfWorkingWeekends > Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfWorkingWeekends())
            sum += 30 * (numberOfWorkingWeekends - Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfWorkingWeekends());

    }
    return sum;
}